

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateCommonBuilderMethods
          (MessageBuilderGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDescriptor *field;
  long *plVar2;
  pointer pcVar3;
  MessageBuilderGenerator *pMVar4;
  bool bVar5;
  int iVar6;
  ImmutableFieldGenerator *pIVar7;
  OneofGeneratorInfo *pOVar8;
  Descriptor *pDVar9;
  int iVar10;
  Descriptor *descriptor;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 uVar11;
  size_type sVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  MessageBuilderGenerator *pMVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  string out;
  string local_80;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_60;
  MessageBuilderGenerator *local_58;
  string local_50;
  
  ClassNameResolver::GetClassName_abi_cxx11_(&local_80,this->name_resolver_,this->descriptor_,true);
  io::Printer::Print(printer,
                     "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  maybeForceBuilderInitialization();\n}\n\n"
                     ,"classname",&local_80);
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_80.field_2._M_local_buf[2],
                                      local_80.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_(&local_80,this->name_resolver_,this->descriptor_,true);
  local_50.field_2._M_allocated_capacity._0_2_ = 0x3356;
  local_50._M_string_length = 2;
  local_50.field_2._M_local_buf[2] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  io::Printer::Print(printer,
                     "private Builder(\n    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n  super(parent);\n  maybeForceBuilderInitialization();\n}\n"
                     ,"classname",&local_80,"ver",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT53(local_50.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_50.field_2._M_local_buf[2],
                                      local_50.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_80.field_2._M_local_buf[2],
                                      local_80.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  local_80.field_2._M_allocated_capacity._0_2_ = 0x3356;
  local_80._M_string_length = 2;
  local_80.field_2._M_local_buf[2] = '\0';
  local_80._M_dataplus._M_p = (pointer)paVar1;
  io::Printer::Print(printer,
                     "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage$ver$\n          .alwaysUseFieldBuilders) {\n"
                     ,"ver",&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_80.field_2._M_local_buf[2],
                                      local_80.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x2c)) {
    lVar20 = 0;
    lVar19 = 0;
    do {
      if (*(long *)(*(long *)(pDVar9 + 0x30) + 0x60 + lVar20) == 0) {
        pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar9 + 0x30) + lVar20));
        (*pIVar7->_vptr_ImmutableFieldGenerator[0x10])(pIVar7,printer);
        pDVar9 = this->descriptor_;
      }
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0xa8;
    } while (lVar19 < *(int *)(pDVar9 + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  io::Printer::Print(printer,"public Builder clear() {\n  super.clear();\n");
  io::Printer::Indent(printer);
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x2c)) {
    lVar20 = 0;
    lVar19 = 0;
    do {
      if (*(long *)(*(long *)(pDVar9 + 0x30) + 0x60 + lVar20) == 0) {
        pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar9 + 0x30) + lVar20));
        (*pIVar7->_vptr_ImmutableFieldGenerator[8])(pIVar7,printer);
        pDVar9 = this->descriptor_;
      }
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0xa8;
    } while (lVar19 < *(int *)(pDVar9 + 0x2c));
  }
  if (0 < *(int *)(pDVar9 + 0x38)) {
    lVar20 = 0;
    lVar19 = 0;
    do {
      pOVar8 = Context::GetOneofGeneratorInfo
                         (this->context_,(OneofDescriptor *)(*(long *)(pDVar9 + 0x40) + lVar20));
      io::Printer::Print(printer,"$oneof_name$Case_ = 0;\n$oneof_name$_ = null;\n","oneof_name",
                         &pOVar8->name);
      lVar19 = lVar19 + 1;
      pDVar9 = this->descriptor_;
      lVar20 = lVar20 + 0x30;
    } while (lVar19 < *(int *)(pDVar9 + 0x38));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return this;\n}\n\n");
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_80,this->name_resolver_,*(FileDescriptor **)(this->descriptor_ + 0x10),true);
  UniqueFileScopeIdentifier_abi_cxx11_(&local_50,(java *)this->descriptor_,descriptor);
  paVar1 = &local_80.field_2;
  io::Printer::Print(printer,
                     "public com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                     ,"fileclass",&local_80,"identifier",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT53(local_50.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_50.field_2._M_local_buf[2],
                                      local_50.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_80.field_2._M_local_buf[2],
                                      local_80.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_(&local_80,this->name_resolver_,this->descriptor_,true);
  io::Printer::Print(printer,
                     "public $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
                     ,"classname",&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_80.field_2._M_local_buf[2],
                                      local_80.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_(&local_80,this->name_resolver_,this->descriptor_,true);
  io::Printer::Print(printer,
                     "public $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\n"
                     ,"classname",&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_80.field_2._M_local_buf[2],
                                      local_80.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_(&local_80,this->name_resolver_,this->descriptor_,true);
  io::Printer::Print(printer,
                     "public $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
                     ,"classname",&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_80.field_2._M_local_buf[2],
                                      local_80.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  io::Printer::Indent(printer);
  pDVar9 = this->descriptor_;
  local_58 = this;
  if (*(int *)(pDVar9 + 0x2c) < 1) {
    iVar14 = 0;
    iVar17 = 0;
    uVar11 = extraout_RDX;
  }
  else {
    local_60 = &this->field_generators_;
    lVar19 = 0;
    lVar20 = 0;
    iVar17 = 0;
    iVar14 = 0;
    do {
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (local_60,(FieldDescriptor *)(*(long *)(pDVar9 + 0x30) + lVar19));
      iVar6 = (*pIVar7->_vptr_ImmutableFieldGenerator[3])(pIVar7);
      iVar14 = iVar14 + iVar6;
      iVar6 = (*pIVar7->_vptr_ImmutableFieldGenerator[2])(pIVar7);
      iVar17 = iVar17 + iVar6;
      lVar20 = lVar20 + 1;
      pDVar9 = local_58->descriptor_;
      lVar19 = lVar19 + 0xa8;
      uVar11 = extraout_RDX_00;
    } while (lVar20 < *(int *)(pDVar9 + 0x2c));
  }
  iVar6 = iVar14 + 0x3e;
  if (-1 < iVar14 + 0x1f) {
    iVar6 = iVar14 + 0x1f;
  }
  iVar10 = iVar17 + 0x3e;
  if (-1 < iVar17 + 0x1f) {
    iVar10 = iVar17 + 0x1f;
  }
  local_60 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
             CONCAT44(local_60._4_4_,iVar10 >> 5);
  if ((*(int *)(*(long *)(pDVar9 + 0x10) + 0x8c) != 3) ||
     (bVar5 = HasRepeatedFields(pDVar9), uVar11 = extraout_RDX_01, bVar5)) {
    if (0 < iVar14) {
      uVar18 = 1;
      if (1 < iVar6 >> 5) {
        uVar18 = iVar6 >> 5;
      }
      uVar13 = 0;
      do {
        GetBitFieldName_abi_cxx11_(&local_80,(java *)(ulong)uVar13,(int)uVar11);
        io::Printer::Print(printer,"int from_$bit_field_name$ = $bit_field_name$;\n",
                           "bit_field_name",&local_80);
        uVar11 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_80.field_2._M_local_buf[2],
                                            local_80.field_2._M_allocated_capacity._0_2_)) + 1);
          uVar11 = extraout_RDX_03;
        }
        uVar13 = uVar13 + 1;
      } while (uVar18 != uVar13);
    }
    if (0 < iVar17) {
      uVar18 = 1;
      if (1 < (int)(uint)local_60) {
        uVar18 = (uint)local_60;
      }
      uVar13 = 0;
      do {
        GetBitFieldName_abi_cxx11_(&local_80,(java *)(ulong)uVar13,(int)uVar11);
        io::Printer::Print(printer,"int to_$bit_field_name$ = 0;\n","bit_field_name",&local_80);
        uVar11 = extraout_RDX_04;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_80.field_2._M_local_buf[2],
                                            local_80.field_2._M_allocated_capacity._0_2_)) + 1);
          uVar11 = extraout_RDX_05;
        }
        uVar13 = uVar13 + 1;
      } while (uVar18 != uVar13);
    }
  }
  pMVar4 = local_58;
  pDVar9 = local_58->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x2c)) {
    this_00 = &local_58->field_generators_;
    lVar20 = 0;
    lVar19 = 0;
    do {
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,(FieldDescriptor *)(*(long *)(pDVar9 + 0x30) + lVar20));
      (*pIVar7->_vptr_ImmutableFieldGenerator[10])(pIVar7,printer);
      lVar19 = lVar19 + 1;
      pDVar9 = pMVar4->descriptor_;
      lVar20 = lVar20 + 0xa8;
      uVar11 = extraout_RDX_06;
    } while (lVar19 < *(int *)(pDVar9 + 0x2c));
  }
  if (((*(int *)(*(long *)(pDVar9 + 0x10) + 0x8c) != 3) ||
      (bVar5 = HasRepeatedFields(pDVar9), uVar11 = extraout_RDX_07, bVar5)) && (0 < iVar17)) {
    uVar18 = 1;
    if (1 < (int)(uint)local_60) {
      uVar18 = (uint)local_60;
    }
    uVar13 = 0;
    do {
      GetBitFieldName_abi_cxx11_(&local_80,(java *)(ulong)uVar13,(int)uVar11);
      io::Printer::Print(printer,"result.$bit_field_name$ = to_$bit_field_name$;\n","bit_field_name"
                         ,&local_80);
      uVar11 = extraout_RDX_08;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_80.field_2._M_local_buf[2],
                                          local_80.field_2._M_allocated_capacity._0_2_)) + 1);
        uVar11 = extraout_RDX_09;
      }
      uVar13 = uVar13 + 1;
    } while (uVar18 != uVar13);
  }
  pMVar4 = local_58;
  pDVar9 = local_58->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x38)) {
    lVar19 = 0;
    lVar20 = 0;
    do {
      pOVar8 = Context::GetOneofGeneratorInfo
                         (pMVar4->context_,(OneofDescriptor *)(*(long *)(pDVar9 + 0x40) + lVar19));
      io::Printer::Print(printer,"result.$oneof_name$Case_ = $oneof_name$Case_;\n","oneof_name",
                         &pOVar8->name);
      lVar20 = lVar20 + 1;
      pDVar9 = pMVar4->descriptor_;
      lVar19 = lVar19 + 0x30;
    } while (lVar20 < *(int *)(pDVar9 + 0x38));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  onBuilt();\n");
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_80,pMVar4->name_resolver_,pMVar4->descriptor_,true);
  io::Printer::Print(printer,"  return result;\n}\n\n","classname",&local_80);
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_80.field_2._M_local_buf[2],
                                      local_80.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  io::Printer::Print(printer,
                     "public Builder clone() {\n  return (Builder) super.clone();\n}\npublic Builder setField(\n    com.google.protobuf.Descriptors.FieldDescriptor field,\n    Object value) {\n  return (Builder) super.setField(field, value);\n}\npublic Builder clearField(\n    com.google.protobuf.Descriptors.FieldDescriptor field) {\n  return (Builder) super.clearField(field);\n}\npublic Builder clearOneof(\n    com.google.protobuf.Descriptors.OneofDescriptor oneof) {\n  return (Builder) super.clearOneof(oneof);\n}\npublic Builder setRepeatedField(\n    com.google.protobuf.Descriptors.FieldDescriptor field,\n    int index, Object value) {\n  return (Builder) super.setRepeatedField(field, index, value);\n}\npublic Builder addRepeatedField(\n    com.google.protobuf.Descriptors.FieldDescriptor field,\n    Object value) {\n  return (Builder) super.addRepeatedField(field, value);\n}\n"
                    );
  pDVar9 = pMVar4->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x68)) {
    ClassNameResolver::GetClassName_abi_cxx11_(&local_80,pMVar4->name_resolver_,pDVar9,true);
    io::Printer::Print(printer,
                       "public <Type> Builder setExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, Type> extension,\n    Type value) {\n  return (Builder) super.setExtension(extension, value);\n}\npublic <Type> Builder setExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, java.util.List<Type>> extension,\n    int index, Type value) {\n  return (Builder) super.setExtension(extension, index, value);\n}\npublic <Type> Builder addExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, java.util.List<Type>> extension,\n    Type value) {\n  return (Builder) super.addExtension(extension, value);\n}\npublic <Type> Builder clearExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, ?> extension) {\n  return (Builder) super.clearExtension(extension);\n}\n"
                       ,"classname",&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_80.field_2._M_local_buf[2],
                                        local_80.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    pDVar9 = pMVar4->descriptor_;
  }
  bVar5 = Context::HasGeneratedMethods(pMVar4->context_,pDVar9);
  if (bVar5) {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_80,pMVar4->name_resolver_,pMVar4->descriptor_,true);
    io::Printer::Print(printer,
                       "public Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
                       ,"classname",&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_80.field_2._M_local_buf[2],
                                        local_80.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_80,pMVar4->name_resolver_,pMVar4->descriptor_,true);
    io::Printer::Print(printer,
                       "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
                       ,"classname",&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_80.field_2._M_local_buf[2],
                                        local_80.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    io::Printer::Indent(printer);
    pDVar9 = pMVar4->descriptor_;
    if (0 < *(int *)(pDVar9 + 0x2c)) {
      lVar20 = 0;
      lVar19 = 0;
      do {
        if (*(long *)(*(long *)(pDVar9 + 0x30) + 0x60 + lVar20) == 0) {
          pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&pMVar4->field_generators_,
                              (FieldDescriptor *)(*(long *)(pDVar9 + 0x30) + lVar20));
          (*pIVar7->_vptr_ImmutableFieldGenerator[9])(pIVar7,printer);
          pDVar9 = pMVar4->descriptor_;
        }
        lVar19 = lVar19 + 1;
        lVar20 = lVar20 + 0xa8;
      } while (lVar19 < *(int *)(pDVar9 + 0x2c));
    }
    pMVar16 = pMVar4;
    if (0 < *(int *)(pDVar9 + 0x38)) {
      lVar19 = 0;
      do {
        pOVar8 = Context::GetOneofGeneratorInfo
                           (pMVar16->context_,
                            (OneofDescriptor *)(*(long *)(pDVar9 + 0x40) + lVar19 * 0x30));
        io::Printer::Print(printer,"switch (other.get$oneof_capitalized_name$Case()) {\n",
                           "oneof_capitalized_name",&pOVar8->capitalized_name);
        io::Printer::Indent(printer);
        lVar20 = *(long *)(pMVar16->descriptor_ + 0x40);
        local_60 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
                   lVar19;
        if (0 < *(int *)(lVar20 + 0x1c + lVar19 * 0x30)) {
          lVar15 = 0;
          do {
            field = *(FieldDescriptor **)(*(long *)(lVar20 + 0x20 + lVar19 * 0x30) + lVar15 * 8);
            plVar2 = *(long **)field;
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            lVar20 = *plVar2;
            std::__cxx11::string::_M_construct<char*>((string *)&local_80,lVar20,plVar2[1] + lVar20)
            ;
            if (local_80._M_string_length != 0) {
              sVar12 = 0;
              do {
                if ((byte)(local_80._M_dataplus._M_p[sVar12] + 0x9fU) < 0x1a) {
                  local_80._M_dataplus._M_p[sVar12] = local_80._M_dataplus._M_p[sVar12] + -0x20;
                }
                sVar12 = sVar12 + 1;
              } while (local_80._M_string_length != sVar12);
            }
            io::Printer::Print(printer,"case $field_name$: {\n","field_name",&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,
                              CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                                       CONCAT12(local_80.field_2._M_local_buf[2],
                                                local_80.field_2._M_allocated_capacity._0_2_)) + 1);
            }
            io::Printer::Indent(printer);
            pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                     get(&pMVar4->field_generators_,field);
            (*pIVar7->_vptr_ImmutableFieldGenerator[9])(pIVar7,printer);
            io::Printer::Print(printer,"break;\n");
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n");
            lVar15 = lVar15 + 1;
            lVar20 = *(long *)(local_58->descriptor_ + 0x40);
          } while (lVar15 < *(int *)(lVar20 + 0x1c + lVar19 * 0x30));
        }
        pOVar8 = Context::GetOneofGeneratorInfo
                           (local_58->context_,(OneofDescriptor *)(lVar20 + lVar19 * 0x30));
        pcVar3 = (pOVar8->name)._M_dataplus._M_p;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar3,pcVar3 + (pOVar8->name)._M_string_length);
        if (local_80._M_string_length != 0) {
          sVar12 = 0;
          do {
            if ((byte)(local_80._M_dataplus._M_p[sVar12] + 0x9fU) < 0x1a) {
              local_80._M_dataplus._M_p[sVar12] = local_80._M_dataplus._M_p[sVar12] + -0x20;
            }
            sVar12 = sVar12 + 1;
          } while (local_80._M_string_length != sVar12);
        }
        io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n",
                           "cap_oneof_name",&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_80.field_2._M_local_buf[2],
                                            local_80.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
        lVar19 = (long)local_60 + 1;
        pDVar9 = local_58->descriptor_;
        pMVar16 = local_58;
      } while (lVar19 < *(int *)(pDVar9 + 0x38));
    }
    io::Printer::Outdent(printer);
    pDVar9 = pMVar16->descriptor_;
    if (0 < *(int *)(pDVar9 + 0x68)) {
      io::Printer::Print(printer,"  this.mergeExtensionFields(other);\n");
      pDVar9 = pMVar16->descriptor_;
    }
    if (*(int *)(*(long *)(pDVar9 + 0x10) + 0x8c) != 3) {
      io::Printer::Print(printer,"  this.mergeUnknownFields(other.unknownFields);\n");
    }
    io::Printer::Print(printer,"  onChanged();\n");
    io::Printer::Print(printer,"  return this;\n}\n\n");
  }
  return;
}

Assistant:

void MessageBuilderGenerator::
GenerateCommonBuilderMethods(io::Printer* printer) {
  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "  maybeForceBuilderInitialization();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "private Builder(\n"
    "    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n"
    "  super(parent);\n"
    "  maybeForceBuilderInitialization();\n"
    "}\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_),
    "ver", GeneratedCodeVersionSuffix());

  printer->Print(
    "private void maybeForceBuilderInitialization() {\n"
    "  if (com.google.protobuf.GeneratedMessage$ver$\n"
    "          .alwaysUseFieldBuilders) {\n",
    "ver", GeneratedCodeVersionSuffix());

  printer->Indent();
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateFieldBuilderInitializationCode(printer);
    }
  }
  printer->Outdent();
  printer->Outdent();

  printer->Print(
    "  }\n"
    "}\n");

  printer->Print(
    "public Builder clear() {\n"
    "  super.clear();\n");

  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateBuilderClearCode(printer);
    }
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "$oneof_name$Case_ = 0;\n"
      "$oneof_name$_ = null;\n",
      "oneof_name", context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
  }

  printer->Outdent();

  printer->Print(
    "  return this;\n"
    "}\n"
    "\n");

  printer->Print(
    "public com.google.protobuf.Descriptors.Descriptor\n"
    "    getDescriptorForType() {\n"
    "  return $fileclass$.internal_$identifier$_descriptor;\n"
    "}\n"
    "\n",
    "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
    "identifier", UniqueFileScopeIdentifier(descriptor_));

  // LITE runtime implements this in GeneratedMessageLite.
  printer->Print(
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return $classname$.getDefaultInstance();\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "public $classname$ build() {\n"
    "  $classname$ result = buildPartial();\n"
    "  if (!result.isInitialized()) {\n"
    "    throw newUninitializedMessageException(result);\n"
    "  }\n"
    "  return result;\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "public $classname$ buildPartial() {\n"
    "  $classname$ result = new $classname$(this);\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();

  int totalBuilderBits = 0;
  int totalMessageBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const ImmutableFieldGenerator& field =
        field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
    totalMessageBits += field.GetNumBitsForMessage();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  int totalMessageInts = (totalMessageBits + 31) / 32;

  if (GenerateHasBits(descriptor_)) {
    // Local vars for from and to bit fields to avoid accessing the builder and
    // message over and over for these fields. Seems to provide a slight
    // perforamance improvement in micro benchmark and this is also what proto1
    // code does.
    for (int i = 0; i < totalBuilderInts; i++) {
      printer->Print("int from_$bit_field_name$ = $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
    for (int i = 0; i < totalMessageInts; i++) {
      printer->Print("int to_$bit_field_name$ = 0;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // Output generation code for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i)).GenerateBuildingCode(printer);
  }

  if (GenerateHasBits(descriptor_)) {
    // Copy the bit field results to the generated message
    for (int i = 0; i < totalMessageInts; i++) {
      printer->Print("result.$bit_field_name$ = to_$bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print("result.$oneof_name$Case_ = $oneof_name$Case_;\n",
                   "oneof_name", context_->GetOneofGeneratorInfo(
                       descriptor_->oneof_decl(i))->name);
  }

  printer->Outdent();

  printer->Print(
    "  onBuilt();\n");

  printer->Print(
    "  return result;\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Override methods declared in GeneratedMessage to return the concrete
  // generated type so callsites won't depend on GeneratedMessage. This
  // is needed to keep binary compatibility when we change generated code
  // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
  // we changed all generated code to subclass GeneratedMessageV3).
  printer->Print(
    "public Builder clone() {\n"
    "  return (Builder) super.clone();\n"
    "}\n"
    "public Builder setField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field,\n"
    "    Object value) {\n"
    "  return (Builder) super.setField(field, value);\n"
    "}\n"
    "public Builder clearField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field) {\n"
    "  return (Builder) super.clearField(field);\n"
    "}\n"
    "public Builder clearOneof(\n"
    "    com.google.protobuf.Descriptors.OneofDescriptor oneof) {\n"
    "  return (Builder) super.clearOneof(oneof);\n"
    "}\n"
    "public Builder setRepeatedField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field,\n"
    "    int index, Object value) {\n"
    "  return (Builder) super.setRepeatedField(field, index, value);\n"
    "}\n"
    "public Builder addRepeatedField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field,\n"
    "    Object value) {\n"
    "  return (Builder) super.addRepeatedField(field, value);\n"
    "}\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "public <Type> Builder setExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, Type> extension,\n"
      "    Type value) {\n"
      "  return (Builder) super.setExtension(extension, value);\n"
      "}\n"
      "public <Type> Builder setExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, java.util.List<Type>> extension,\n"
      "    int index, Type value) {\n"
      "  return (Builder) super.setExtension(extension, index, value);\n"
      "}\n"
      "public <Type> Builder addExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, java.util.List<Type>> extension,\n"
      "    Type value) {\n"
      "  return (Builder) super.addExtension(extension, value);\n"
      "}\n"
      "public <Type> Builder clearExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, ?> extension) {\n"
      "  return (Builder) super.clearExtension(extension);\n"
      "}\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
  }

  // -----------------------------------------------------------------

  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print(
      "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
      "  if (other instanceof $classname$) {\n"
      "    return mergeFrom(($classname$)other);\n"
      "  } else {\n"
      "    super.mergeFrom(other);\n"
      "    return this;\n"
      "  }\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

    printer->Print(
      "public Builder mergeFrom($classname$ other) {\n"
      // Optimization:  If other is the default instance, we know none of its
      //   fields are set so we can skip the merge.
      "  if (other == $classname$.getDefaultInstance()) return this;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!descriptor_->field(i)->containing_oneof()) {
        field_generators_.get(
            descriptor_->field(i)).GenerateMergingCode(printer);
      }
    }

    // Merge oneof fields.
    for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
      printer->Print(
        "switch (other.get$oneof_capitalized_name$Case()) {\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(
            descriptor_->oneof_decl(i))->capitalized_name);
      printer->Indent();
      for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
        printer->Print(
          "case $field_name$: {\n",
          "field_name",
          ToUpper(field->name()));
        printer->Indent();
        field_generators_.get(field).GenerateMergingCode(printer);
        printer->Print(
            "break;\n");
        printer->Outdent();
        printer->Print(
            "}\n");
      }
      printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(context_->GetOneofGeneratorInfo(
            descriptor_->oneof_decl(i))->name));
      printer->Outdent();
      printer->Print(
          "}\n");
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print(
        "  this.mergeExtensionFields(other);\n");
    }

    if (PreserveUnknownFields(descriptor_)) {
      printer->Print(
        "  this.mergeUnknownFields(other.unknownFields);\n");
    }

    printer->Print(
      "  onChanged();\n");

    printer->Print(
      "  return this;\n"
      "}\n"
      "\n");
  }
}